

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O0

void stack_init(lua_State *L1,lua_State *L)

{
  uint uVar1;
  ulong *puVar2;
  TValue *local_90;
  TValue *st;
  TValue *stend;
  lua_State *L_local;
  lua_State *L1_local;
  
  puVar2 = (ulong *)lj_mem_realloc(L,(void *)0x0,0,0x178);
  (L1->stack).ptr64 = (uint64_t)puVar2;
  L1->stacksize = 0x2f;
  uVar1 = L1->stacksize;
  (L1->maxstack).ptr64 = (uint64_t)((TValue *)(puVar2 + uVar1) + -8);
  *puVar2 = (ulong)L1 | 0xfffc800000000000;
  local_90 = (TValue *)(puVar2 + 2);
  puVar2[1] = 0xffffffffffffffff;
  L1->top = local_90;
  L1->base = local_90;
  while (local_90 < (TValue *)(puVar2 + uVar1)) {
    local_90->u64 = 0xffffffffffffffff;
    local_90 = local_90 + 1;
  }
  return;
}

Assistant:

static void stack_init(lua_State *L1, lua_State *L)
{
  TValue *stend, *st = lj_mem_newvec(L, LJ_STACK_START+LJ_STACK_EXTRA, TValue);
  setmref(L1->stack, st);
  L1->stacksize = LJ_STACK_START + LJ_STACK_EXTRA;
  stend = st + L1->stacksize;
  setmref(L1->maxstack, stend - LJ_STACK_EXTRA - 1);
  setthreadV(L1, st++, L1);  /* Needed for curr_funcisL() on empty stack. */
  if (LJ_FR2) setnilV(st++);
  L1->base = L1->top = st;
  while (st < stend)  /* Clear new slots. */
    setnilV(st++);
}